

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbfgsb.c
# Opt level: O1

int formk_(integer *n,integer *nsub,integer *ind,integer *nenter,integer *ileave,integer *indx2,
          integer *iupdat,logical *updatd,doublereal *wn,doublereal *wn1,integer *m,doublereal *ws,
          doublereal *wy,doublereal *sy,doublereal *theta,integer *col,integer *head,integer *info)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  integer iVar4;
  integer *piVar5;
  doublereal *pdVar6;
  uint *puVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  double *pdVar11;
  doublereal *pdVar12;
  uint uVar13;
  doublereal *pdVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  doublereal *pdVar18;
  long lVar19;
  doublereal *pdVar20;
  ulong uVar21;
  int iVar22;
  uint *puVar23;
  long lVar24;
  ulong uVar25;
  uint *puVar26;
  bool bVar27;
  double dVar28;
  doublereal dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  uint local_d8;
  uint local_d4;
  ulong local_d0;
  undefined8 local_c8;
  double *local_c0;
  integer *local_b8;
  doublereal *local_b0;
  long local_a8;
  uint *local_a0;
  doublereal *local_98;
  doublereal *local_90;
  doublereal *local_88;
  doublereal *local_80;
  long local_78;
  doublereal *local_70;
  doublereal *local_68;
  uint *local_60;
  ulong local_58;
  undefined8 local_50;
  doublereal *local_48;
  int local_3c;
  ulong local_38;
  
  iVar9 = *m;
  local_58 = (ulong)iVar9;
  local_d0 = (ulong)*n;
  uVar21 = ~local_d0;
  local_d4 = iVar9 * 2;
  local_48 = (doublereal *)(long)(int)~local_d4;
  pdVar18 = wn1 + (long)local_48;
  local_78 = (long)(int)local_d4;
  local_a0 = (uint *)n;
  local_80 = pdVar18;
  local_60 = (uint *)nenter;
  local_50 = ileave;
  if (*updatd == 0) {
    uVar13 = *col;
  }
  else {
    local_c0 = (double *)nsub;
    local_b8 = ind;
    if ((iVar9 < *iupdat) && (formk_::jy = 1, 1 < iVar9)) {
      local_c8 = CONCAT44(local_c8._4_4_,local_d4) | 1;
      do {
        formk_::js = *m + formk_::jy;
        local_d8 = *m - formk_::jy;
        iVar9 = (int)local_c8;
        Wcopy_((integer *)&local_d8,pdVar18 + (formk_::jy + 1) * (int)local_c8,&c__1,
               pdVar18 + formk_::jy * (int)local_c8,&c__1);
        local_d8 = *m - formk_::jy;
        Wcopy_((integer *)&local_d8,pdVar18 + (formk_::js + 1) * iVar9,&c__1,
               pdVar18 + formk_::js * iVar9,&c__1);
        iVar9 = *m;
        local_d8 = iVar9 - 1;
        Wcopy_((integer *)&local_d8,pdVar18 + (int)((formk_::jy + 1) * local_d4 + iVar9 + 2),&c__1,
               pdVar18 + (int)(iVar9 + formk_::jy * local_d4 + 1),&c__1);
        formk_::jy = formk_::jy + 1;
      } while (formk_::jy < (int)local_58);
    }
    uVar13 = *(uint *)local_c0;
    local_c8 = (ulong)uVar13;
    uVar1 = *local_a0;
    local_c0 = (double *)CONCAT44(local_c0._4_4_,uVar1);
    uVar2 = *col;
    local_a8 = (long)*m + (long)(int)uVar2;
    iVar9 = *head;
    formk_::ipntr = uVar2 + iVar9 + -1;
    iVar8 = formk_::ipntr - *m;
    if (iVar8 != 0 && *m <= formk_::ipntr) {
      formk_::ipntr = iVar8;
    }
    pdVar12 = (doublereal *)(ulong)(uVar13 + 1);
    if (0 < (int)uVar2) {
      iVar8 = *m;
      local_90 = pdVar18 + uVar2;
      local_88 = (doublereal *)((ulong)uVar2 + 1);
      local_b0 = pdVar18 + local_a8;
      pdVar18 = (doublereal *)0x1;
      do {
        if ((int)uVar13 < 1) {
          dVar28 = 0.0;
        }
        else {
          dVar28 = 0.0;
          lVar17 = 0;
          do {
            dVar28 = dVar28 + wy[uVar21 + (long)(formk_::ipntr * (int)local_d0 + local_b8[lVar17])]
                              * wy[uVar21 + (long)(local_b8[lVar17] + iVar9 * (int)local_d0)];
            lVar17 = lVar17 + 1;
          } while ((long)pdVar12 - 1U != lVar17);
        }
        dVar30 = 0.0;
        dVar31 = 0.0;
        if ((int)uVar13 < (int)uVar1) {
          lVar17 = 0;
          do {
            lVar24 = (long)(local_b8[(int)uVar13 + lVar17] + iVar9 * (int)local_d0);
            dVar30 = dVar30 + wy[uVar21 + lVar24] *
                              ws[uVar21 + (long)(formk_::ipntr * (int)local_d0 +
                                                local_b8[(int)uVar13 + lVar17])];
            dVar31 = dVar31 + ws[uVar21 + lVar24] *
                              ws[uVar21 + (long)(formk_::ipntr * (int)local_d0 +
                                                local_b8[(int)uVar13 + lVar17])];
            lVar17 = lVar17 + 1;
          } while (uVar1 - uVar13 != (int)lVar17);
        }
        formk_::js = iVar8 + (int)pdVar18;
        local_90[(long)pdVar18 * local_78] = dVar28;
        local_80[(int)(formk_::js * local_d4 + (int)local_a8)] = dVar31;
        local_b0[(long)pdVar18 * local_78] = dVar30;
        iVar9 = iVar9 % iVar8 + 1;
        pdVar18 = (doublereal *)((long)pdVar18 + 1);
        local_d8 = uVar1;
        local_98 = pdVar12;
      } while (pdVar18 != local_88);
    }
    iVar9 = *col;
    iVar8 = *head;
    formk_::jpntr = iVar9 + iVar8 + -1;
    iVar10 = formk_::jpntr - *m;
    if (iVar10 != 0 && *m <= formk_::jpntr) {
      formk_::jpntr = iVar10;
    }
    formk_::jy = iVar9;
    if (0 < iVar9) {
      iVar15 = formk_::jpntr * (int)local_d0;
      iVar10 = *m;
      iVar16 = 1;
      do {
        if ((int)uVar13 < 1) {
          dVar28 = 0.0;
        }
        else {
          dVar28 = 0.0;
          lVar17 = 0;
          do {
            dVar28 = dVar28 + ws[uVar21 + (long)(iVar8 * (int)local_d0 + local_b8[lVar17])] *
                              wy[uVar21 + (long)(local_b8[lVar17] + iVar15)];
            lVar17 = lVar17 + 1;
          } while ((long)pdVar12 - 1U != lVar17);
        }
        iVar8 = iVar8 % iVar10 + 1;
        local_80[(int)(iVar10 + iVar16 + iVar9 * local_d4)] = dVar28;
        bVar27 = iVar16 != iVar9;
        iVar16 = iVar16 + 1;
        local_d8 = uVar13;
      } while (bVar27);
    }
    uVar13 = *col - 1;
  }
  pdVar18 = local_48;
  uVar1 = local_d4;
  local_68 = (doublereal *)(ulong)uVar13;
  iVar9 = *head;
  if (0 < (int)uVar13) {
    local_98 = (doublereal *)(ulong)(uVar13 + 1);
    iVar8 = *m;
    iVar10 = *head;
    local_70 = (doublereal *)CONCAT44(local_70._4_4_,iVar10);
    uVar2 = *local_60;
    local_c0 = (double *)(ulong)uVar2;
    uVar3 = *local_a0;
    iVar16 = *local_50;
    local_88 = (doublereal *)(long)iVar16;
    local_a8 = CONCAT44(local_a8._4_4_,uVar3);
    local_c8 = 2;
    pdVar12 = (doublereal *)0x1;
    do {
      local_b0 = pdVar12;
      local_d8 = (uint)local_b0;
      local_b8 = (integer *)CONCAT44(local_b8._4_4_,local_d8 + iVar8);
      local_90 = (doublereal *)CONCAT44(local_90._4_4_,iVar9);
      uVar25 = 1;
      formk_::jpntr = iVar10;
      do {
        dVar28 = 0.0;
        dVar30 = 0.0;
        dVar31 = 0.0;
        dVar32 = 0.0;
        if (0 < (int)uVar2) {
          lVar17 = 0;
          do {
            lVar24 = (long)(iVar9 * (int)local_d0 + indx2[lVar17]);
            lVar19 = (long)(indx2[lVar17] + formk_::jpntr * (int)local_d0);
            dVar31 = dVar31 + ws[uVar21 + lVar19] * ws[uVar21 + lVar24];
            dVar32 = dVar32 + wy[uVar21 + lVar19] * wy[uVar21 + lVar24];
            lVar17 = lVar17 + 1;
          } while ((ulong)(uVar2 + 1) - 1 != lVar17);
        }
        if (iVar16 <= (int)uVar3) {
          dVar28 = 0.0;
          dVar30 = 0.0;
          lVar17 = -1;
          do {
            lVar24 = (long)(iVar9 * (int)local_d0 + indx2[(long)local_88 + lVar17]);
            lVar19 = (long)(indx2[(long)local_88 + lVar17] + formk_::jpntr * (int)local_d0);
            dVar28 = dVar28 + ws[uVar21 + lVar19] * ws[uVar21 + lVar24];
            dVar30 = dVar30 + wy[uVar21 + lVar19] * wy[uVar21 + lVar24];
            lVar17 = lVar17 + 1;
          } while (uVar3 - iVar16 != (int)lVar17);
        }
        formk_::js = iVar8 + (int)uVar25;
        local_80[(long)((long)local_b0 + uVar25 * local_78)] =
             (dVar32 + local_80[(long)((long)local_b0 + uVar25 * local_78)]) - dVar30;
        iVar15 = formk_::js * local_d4 + local_d8 + iVar8;
        local_80[iVar15] = (local_80[iVar15] - dVar31) + dVar28;
        formk_::jpntr = formk_::jpntr % iVar8 + 1;
        uVar25 = uVar25 + 1;
      } while (uVar25 != local_c8);
      iVar9 = iVar9 % iVar8 + 1;
      local_c8 = local_c8 + 1;
      pdVar12 = (doublereal *)((long)local_b0 + 1U);
    } while ((doublereal *)((long)local_b0 + 1U) != local_98);
    formk_::jy = (integer)uVar25;
  }
  formk_::ipntr = *head;
  iVar9 = *m;
  formk_::is = iVar9 + 1;
  if (0 < (int)uVar13) {
    local_b8 = (integer *)(ulong)(uVar13 + 1);
    local_98 = (doublereal *)(long)(int)(iVar9 + uVar13);
    iVar8 = *head;
    local_70 = (doublereal *)CONCAT44(local_70._4_4_,iVar8);
    uVar2 = *local_60;
    local_c0 = (double *)(ulong)uVar2;
    uVar3 = *local_a0;
    iVar10 = *local_50;
    local_88 = (doublereal *)(long)iVar10;
    iVar16 = *m;
    local_c8 = CONCAT44(local_c8._4_4_,iVar16);
    local_a0 = (uint *)(long)iVar16;
    local_a8 = CONCAT44(local_a8._4_4_,uVar3);
    pdVar12 = (doublereal *)(long)formk_::is;
    do {
      local_b0 = pdVar12;
      local_90 = (doublereal *)CONCAT44(local_90._4_4_,formk_::ipntr);
      piVar5 = (integer *)0x1;
      formk_::jpntr = iVar8;
      do {
        dVar28 = 0.0;
        dVar30 = 0.0;
        if (0 < (int)uVar2) {
          lVar17 = 0;
          do {
            dVar30 = dVar30 + ws[uVar21 + (long)(formk_::ipntr * (int)local_d0 + indx2[lVar17])] *
                              wy[uVar21 + (long)(indx2[lVar17] + formk_::jpntr * (int)local_d0)];
            lVar17 = lVar17 + 1;
          } while ((ulong)(uVar2 + 1) - 1 != lVar17);
        }
        if (iVar10 <= (int)uVar3) {
          dVar28 = 0.0;
          lVar17 = -1;
          do {
            dVar28 = dVar28 + ws[uVar21 + (long)(formk_::ipntr * (int)local_d0 +
                                                indx2[(long)local_88 + lVar17])] *
                              wy[uVar21 + (long)(indx2[(long)local_88 + lVar17] +
                                                formk_::jpntr * (int)local_d0)];
            lVar17 = lVar17 + 1;
          } while (uVar3 - iVar10 != (int)lVar17);
        }
        if ((long)iVar9 - (long)local_a0 < (long)piVar5) {
          local_80[(long)((long)local_b0 + (long)piVar5 * local_78)] =
               (dVar30 + local_80[(long)((long)local_b0 + (long)piVar5 * local_78)]) - dVar28;
        }
        else {
          local_80[(long)((long)local_b0 + (long)piVar5 * local_78)] =
               (local_80[(long)((long)local_b0 + (long)piVar5 * local_78)] - dVar30) + dVar28;
        }
        formk_::jpntr = formk_::jpntr % iVar16 + 1;
        piVar5 = (integer *)((long)piVar5 + 1);
      } while (piVar5 != local_b8);
      formk_::ipntr = formk_::ipntr % iVar16 + 1;
      iVar9 = (int)local_b0;
      pdVar12 = (doublereal *)((long)local_b0 + 1U);
    } while ((long)local_b0 < (long)local_98);
    formk_::is = (integer)(doublereal *)((long)local_b0 + 1U);
    formk_::jy = (integer)piVar5;
    local_d8 = uVar13;
  }
  formk_::m2 = *m * 2;
  if (0 < *col) {
    local_70 = sy + ~local_58;
    iVar10 = (int)local_58;
    local_a0 = (uint *)CONCAT44(local_a0._4_4_,iVar10 + 1);
    local_50 = (int *)(CONCAT44(local_50._4_4_,local_d4) | 1);
    local_98 = (doublereal *)((ulong)(uint)*col + 2);
    local_d8 = *col;
    local_b0 = (doublereal *)(ulong)local_d8;
    local_58 = (ulong)(int)local_d8;
    local_60 = (uint *)(ulong)(local_d8 + 1);
    lVar17 = (long)(int)(-2 - local_d4);
    pdVar20 = wn + local_78 + lVar17 + 2;
    iVar16 = (local_d8 + 1) * iVar10;
    iVar9 = *m + 1;
    iVar8 = *m + iVar10 * iVar9 * 2;
    local_68 = wn1 + local_78 + lVar17 + 1;
    uVar21 = (ulong)(local_d8 + 1 + iVar16 * 2);
    iVar16 = iVar16 * 2;
    pdVar14 = wn + lVar17 + 2;
    local_38 = (ulong)local_d4;
    puVar23 = (uint *)0x1;
    local_d0 = 0;
    pdVar11 = wn1 + local_78 + lVar17 + 2;
    pdVar12 = (doublereal *)0x2;
    pdVar6 = local_68;
    do {
      local_90 = pdVar6;
      local_88 = pdVar12;
      local_c0 = pdVar11;
      iVar8 = iVar8 + 1;
      local_a8 = CONCAT44(local_a8._4_4_,iVar16);
      local_c8 = CONCAT44(local_c8._4_4_,iVar9);
      pdVar12 = local_90 + iVar9;
      pdVar6 = local_68 + iVar9;
      iVar22 = (int)puVar23;
      formk_::is = local_d8 + iVar22;
      local_b8 = (integer *)CONCAT44(local_b8._4_4_,iVar8);
      puVar26 = (uint *)0x0;
      pdVar11 = local_c0;
      iVar15 = iVar8;
      do {
        pdVar20[(long)puVar26] = *pdVar11 / *theta;
        wn[(long)local_48 + (long)((int)uVar21 + (int)puVar26)] = local_80[iVar15] * *theta;
        puVar26 = (uint *)((long)puVar26 + 1);
        pdVar11 = pdVar11 + local_78;
        iVar15 = iVar15 + local_d4;
      } while (puVar23 != puVar26);
      if ((uint *)0x1 < puVar23) {
        uVar25 = 0;
        do {
          *(double *)((long)pdVar14 + uVar25 + (long)iVar16 * 8) = -*pdVar6;
          uVar25 = uVar25 + 8;
          pdVar6 = pdVar6 + local_78;
        } while (local_d0 != uVar25);
      }
      puVar7 = puVar23;
      if ((long)puVar23 <= (long)local_58) {
        do {
          pdVar14[(long)puVar7 + (long)iVar16 + -1] = *pdVar12;
          puVar7 = (uint *)((long)puVar7 + 1);
          pdVar12 = pdVar12 + local_78;
        } while (local_60 != puVar7);
      }
      wn[(long)local_48 + (long)((int)local_50 * iVar22)] =
           local_70[(iVar10 + 1) * iVar22] + wn[(long)local_48 + (long)((int)local_50 * iVar22)];
      puVar23 = (uint *)((long)puVar23 + 1);
      pdVar20 = pdVar20 + local_78;
      uVar21 = uVar21 + local_38;
      iVar16 = iVar16 + local_d4;
      iVar9 = iVar9 + 1;
      local_d0 = local_d0 + 8;
      pdVar11 = local_c0 + 1;
      pdVar12 = (doublereal *)((long)local_88 + 1U);
      pdVar6 = local_90 + local_78;
    } while ((doublereal *)((long)local_88 + 1U) != local_98);
    formk_::js = (int)puVar26 + local_d8;
    formk_::jy = (integer)puVar7;
    local_48 = pdVar14;
    local_3c = formk_::is;
  }
  dpofa_(wn,&formk_::m2,col,info);
  iVar4 = -1;
  if (*info == 0) {
    formk_::js = *col;
    iVar9 = formk_::js * 2;
    formk_::col2 = iVar9;
    while (lVar17 = local_78, iVar4 = formk_::col2, iVar8 = formk_::js + 1, formk_::js < iVar9) {
      formk_::js = iVar8;
      dtrsl_(wn,&formk_::m2,col,wn + (long)pdVar18 + (long)(int)(iVar8 * uVar1 | 1),&c__11,info);
    }
    formk_::js = iVar8;
    formk_::is = *col;
    while (iVar9 = formk_::is + 1, formk_::is < iVar4) {
      formk_::is = iVar9;
      local_d8 = formk_::col2;
      formk_::js = iVar9;
      if (iVar9 <= formk_::col2) {
        do {
          formk_::js = iVar9;
          dVar29 = Wdot_(col,wn + (long)pdVar18 + formk_::is * lVar17 + 1,&c__1,
                         wn + (long)pdVar18 + (long)(int)(iVar9 * uVar1 | 1),&c__1);
          lVar24 = (long)(int)(formk_::js * uVar1) + (long)formk_::is;
          wn[(long)pdVar18 + lVar24] = dVar29 + wn[(long)pdVar18 + lVar24];
          iVar9 = formk_::js + 1;
          bVar27 = formk_::js < (int)local_d8;
          formk_::js = iVar9;
        } while (bVar27);
      }
    }
    formk_::is = iVar9;
    dpofa_(wn + (long)pdVar18 + (long)(int)((uVar1 | 1) * (*col + 1)),&formk_::m2,col,info);
    iVar4 = -2;
    if (*info == 0) {
      return 0;
    }
  }
  *info = iVar4;
  return 0;
}

Assistant:

int formk_(integer *n, integer *nsub, integer *ind, integer *
	nenter, integer *ileave, integer *indx2, integer *iupdat, logical *
	updatd, doublereal *wn, doublereal *wn1, integer *m, doublereal *ws, 
	doublereal *wy, doublereal *sy, doublereal *theta, integer *col, 
	integer *head, integer *info)
{
    /* System generated locals */
    integer wn_dim1, wn_offset, wn1_dim1, wn1_offset, ws_dim1, ws_offset, 
	    wy_dim1, wy_offset, sy_dim1, sy_offset, i__1, i__2, i__3;

    /* Local variables */
    static integer i__, k, k1, m2, is, js, iy, jy, is1, js1, col2, dend, pend;
    extern doublereal ddot_(integer *, doublereal *, integer *, doublereal *, 
	    integer *);
    static integer upcl;
    static doublereal temp1, temp2, temp3, temp4;
    extern /* Subroutine */ int dpofa_(doublereal *, integer *, integer *, 
	    integer *), dcopy_(integer *, doublereal *, integer *, doublereal 
	    *, integer *), dtrsl_(doublereal *, integer *, integer *, 
	    doublereal *, integer *, integer *);
    static integer ipntr, jpntr, dbegin, pbegin;

/*     ************ */

/*     Subroutine formk */

/*     This subroutine forms  the LEL^T factorization of the indefinite */

/*       matrix    K = [-D -Y'ZZ'Y/theta     L_a'-R_z'  ] */
/*                     [L_a -R_z           theta*S'AA'S ] */
/*                                                    where E = [-I  0] */
/*                                                              [ 0  I] */
/*     The matrix K can be shown to be equal to the matrix M^[-1]N */
/*       occurring in section 5.1 of [1], as well as to the matrix */
/*       Mbar^[-1] Nbar in section 5.3. */

/*     n is an integer variable. */
/*       On entry n is the dimension of the problem. */
/*       On exit n is unchanged. */

/*     nsub is an integer variable */
/*       On entry nsub is the number of subspace variables in free set. */
/*       On exit nsub is not changed. */

/*     ind is an integer array of dimension nsub. */
/*       On entry ind specifies the indices of subspace variables. */
/*       On exit ind is unchanged. */

/*     nenter is an integer variable. */
/*       On entry nenter is the number of variables entering the */
/*         free set. */
/*       On exit nenter is unchanged. */

/*     ileave is an integer variable. */
/*       On entry indx2(ileave),...,indx2(n) are the variables leaving */
/*         the free set. */
/*       On exit ileave is unchanged. */

/*     indx2 is an integer array of dimension n. */
/*       On entry indx2(1),...,indx2(nenter) are the variables entering */
/*         the free set, while indx2(ileave),...,indx2(n) are the */
/*         variables leaving the free set. */
/*       On exit indx2 is unchanged. */

/*     iupdat is an integer variable. */
/*       On entry iupdat is the total number of BFGS updates made so far. */
/*       On exit iupdat is unchanged. */

/*     updatd is a logical variable. */
/*       On entry 'updatd' is true if the L-BFGS matrix is updatd. */
/*       On exit 'updatd' is unchanged. */

/*     wn is a double precision array of dimension 2m x 2m. */
/*       On entry wn is unspecified. */
/*       On exit the upper triangle of wn stores the LEL^T factorization */
/*         of the 2*col x 2*col indefinite matrix */
/*                     [-D -Y'ZZ'Y/theta     L_a'-R_z'  ] */
/*                     [L_a -R_z           theta*S'AA'S ] */

/*     wn1 is a double precision array of dimension 2m x 2m. */
/*       On entry wn1 stores the lower triangular part of */
/*                     [Y' ZZ'Y   L_a'+R_z'] */
/*                     [L_a+R_z   S'AA'S   ] */
/*         in the previous iteration. */
/*       On exit wn1 stores the corresponding updated matrices. */
/*       The purpose of wn1 is just to store these inner products */
/*       so they can be easily updated and inserted into wn. */

/*     m is an integer variable. */
/*       On entry m is the maximum number of variable metric corrections */
/*         used to define the limited memory matrix. */
/*       On exit m is unchanged. */

/*     ws, wy, sy, and wtyy are double precision arrays; */
/*     theta is a double precision variable; */
/*     col is an integer variable; */
/*     head is an integer variable. */
/*       On entry they store the information defining the */
/*                                          limited memory BFGS matrix: */
/*         ws(n,m) stores S, a set of s-vectors; */
/*         wy(n,m) stores Y, a set of y-vectors; */
/*         sy(m,m) stores S'Y; */
/*         wtyy(m,m) stores the Cholesky factorization */
/*                                   of (theta*S'S+LD^(-1)L') */
/*         theta is the scaling factor specifying B_0 = theta I; */
/*         col is the number of variable metric corrections stored; */
/*         head is the location of the 1st s- (or y-) vector in S (or Y). */
/*       On exit they are unchanged. */

/*     info is an integer variable. */
/*       On entry info is unspecified. */
/*       On exit info =  0 for normal return; */
/*                    = -1 when the 1st Cholesky factorization failed; */
/*                    = -2 when the 2st Cholesky factorization failed. */

/*     Subprograms called: */

/*       Linpack ... dcopy, dpofa, dtrsl. */


/*     References: */
/*       [1] R. H. Byrd, P. Lu, J. Nocedal and C. Zhu, ``A limited */
/*       memory algorithm for bound constrained optimization'', */
/*       SIAM J. Scientific Computing 16 (1995), no. 5, pp. 1190--1208. */

/*       [2] C. Zhu, R.H. Byrd, P. Lu, J. Nocedal, ``L-BFGS-B: a */
/*       limited memory FORTRAN code for solving bound constrained */
/*       optimization problems'', Tech. Report, NAM-11, EECS Department, */
/*       Northwestern University, 1994. */

/*       (Postscript files of these papers are available via anonymous */
/*        ftp to eecs.nwu.edu in the directory pub/lbfgs/lbfgs_bcm.) */

/*                           *  *  * */

/*     NEOS, November 1994. (Latest revision June 1996.) */
/*     Optimization Technology Center. */
/*     Argonne National Laboratory and Northwestern University. */
/*     Written by */
/*                        Ciyou Zhu */
/*     in collaboration with R.H. Byrd, P. Lu-Chen and J. Nocedal. */


/*     ************ */
/*     Form the lower triangular part of */
/*               WN1 = [Y' ZZ'Y   L_a'+R_z'] */
/*                     [L_a+R_z   S'AA'S   ] */
/*        where L_a is the strictly lower triangular part of S'AA'Y */
/*              R_z is the upper triangular part of S'ZZ'Y. */
    /* Parameter adjustments */
    --indx2;
    --ind;
    sy_dim1 = *m;
    sy_offset = 1 + sy_dim1;
    sy -= sy_offset;
    wy_dim1 = *n;
    wy_offset = 1 + wy_dim1;
    wy -= wy_offset;
    ws_dim1 = *n;
    ws_offset = 1 + ws_dim1;
    ws -= ws_offset;
    wn1_dim1 = 2 * *m;
    wn1_offset = 1 + wn1_dim1;
    wn1 -= wn1_offset;
    wn_dim1 = 2 * *m;
    wn_offset = 1 + wn_dim1;
    wn -= wn_offset;

    /* Function Body */
    if (*updatd) {
	if (*iupdat > *m) {
/*                                 shift old part of WN1. */
	    i__1 = *m - 1;
	    for (jy = 1; jy <= i__1; ++jy) {
		js = *m + jy;
		i__2 = *m - jy;
		dcopy_(&i__2, &wn1[jy + 1 + (jy + 1) * wn1_dim1], &c__1, &wn1[
			jy + jy * wn1_dim1], &c__1);
		i__2 = *m - jy;
		dcopy_(&i__2, &wn1[js + 1 + (js + 1) * wn1_dim1], &c__1, &wn1[
			js + js * wn1_dim1], &c__1);
		i__2 = *m - 1;
		dcopy_(&i__2, &wn1[*m + 2 + (jy + 1) * wn1_dim1], &c__1, &wn1[
			*m + 1 + jy * wn1_dim1], &c__1);
/* L10: */
	    }
	}
/*          put new rows in blocks (1,1), (2,1) and (2,2). */
	pbegin = 1;
	pend = *nsub;
	dbegin = *nsub + 1;
	dend = *n;
	iy = *col;
	is = *m + *col;
	ipntr = *head + *col - 1;
	if (ipntr > *m) {
	    ipntr -= *m;
	}
	jpntr = *head;
	i__1 = *col;
	for (jy = 1; jy <= i__1; ++jy) {
	    js = *m + jy;
	    temp1 = 0.;
	    temp2 = 0.;
	    temp3 = 0.;
/*             compute element jy of row 'col' of Y'ZZ'Y */
	    i__2 = pend;
	    for (k = pbegin; k <= i__2; ++k) {
		k1 = ind[k];
		temp1 += wy[k1 + ipntr * wy_dim1] * wy[k1 + jpntr * wy_dim1];
/* L15: */
	    }
/*             compute elements jy of row 'col' of L_a and S'AA'S */
	    i__2 = dend;
	    for (k = dbegin; k <= i__2; ++k) {
		k1 = ind[k];
		temp2 += ws[k1 + ipntr * ws_dim1] * ws[k1 + jpntr * ws_dim1];
		temp3 += ws[k1 + ipntr * ws_dim1] * wy[k1 + jpntr * wy_dim1];
/* L16: */
	    }
	    wn1[iy + jy * wn1_dim1] = temp1;
	    wn1[is + js * wn1_dim1] = temp2;
	    wn1[is + jy * wn1_dim1] = temp3;
	    jpntr = jpntr % *m + 1;
/* L20: */
	}
/*          put new column in block (2,1). */
	jy = *col;
	jpntr = *head + *col - 1;
	if (jpntr > *m) {
	    jpntr -= *m;
	}
	ipntr = *head;
	i__1 = *col;
	for (i__ = 1; i__ <= i__1; ++i__) {
	    is = *m + i__;
	    temp3 = 0.;
/*             compute element i of column 'col' of R_z */
	    i__2 = pend;
	    for (k = pbegin; k <= i__2; ++k) {
		k1 = ind[k];
		temp3 += ws[k1 + ipntr * ws_dim1] * wy[k1 + jpntr * wy_dim1];
/* L25: */
	    }
	    ipntr = ipntr % *m + 1;
	    wn1[is + jy * wn1_dim1] = temp3;
/* L30: */
	}
	upcl = *col - 1;
    } else {
	upcl = *col;
    }
/*       modify the old parts in blocks (1,1) and (2,2) due to changes */
/*       in the set of free variables. */
    ipntr = *head;
    i__1 = upcl;
    for (iy = 1; iy <= i__1; ++iy) {
	is = *m + iy;
	jpntr = *head;
	i__2 = iy;
	for (jy = 1; jy <= i__2; ++jy) {
	    js = *m + jy;
	    temp1 = 0.;
	    temp2 = 0.;
	    temp3 = 0.;
	    temp4 = 0.;
	    i__3 = *nenter;
	    for (k = 1; k <= i__3; ++k) {
		k1 = indx2[k];
		temp1 += wy[k1 + ipntr * wy_dim1] * wy[k1 + jpntr * wy_dim1];
		temp2 += ws[k1 + ipntr * ws_dim1] * ws[k1 + jpntr * ws_dim1];
/* L35: */
	    }
	    i__3 = *n;
	    for (k = *ileave; k <= i__3; ++k) {
		k1 = indx2[k];
		temp3 += wy[k1 + ipntr * wy_dim1] * wy[k1 + jpntr * wy_dim1];
		temp4 += ws[k1 + ipntr * ws_dim1] * ws[k1 + jpntr * ws_dim1];
/* L36: */
	    }
	    wn1[iy + jy * wn1_dim1] = wn1[iy + jy * wn1_dim1] + temp1 - temp3;
	    wn1[is + js * wn1_dim1] = wn1[is + js * wn1_dim1] - temp2 + temp4;
	    jpntr = jpntr % *m + 1;
/* L40: */
	}
	ipntr = ipntr % *m + 1;
/* L45: */
    }
/*       modify the old parts in block (2,1). */
    ipntr = *head;
    i__1 = *m + upcl;
    for (is = *m + 1; is <= i__1; ++is) {
	jpntr = *head;
	i__2 = upcl;
	for (jy = 1; jy <= i__2; ++jy) {
	    temp1 = 0.;
	    temp3 = 0.;
	    i__3 = *nenter;
	    for (k = 1; k <= i__3; ++k) {
		k1 = indx2[k];
		temp1 += ws[k1 + ipntr * ws_dim1] * wy[k1 + jpntr * wy_dim1];
/* L50: */
	    }
	    i__3 = *n;
	    for (k = *ileave; k <= i__3; ++k) {
		k1 = indx2[k];
		temp3 += ws[k1 + ipntr * ws_dim1] * wy[k1 + jpntr * wy_dim1];
/* L51: */
	    }
	    if (is <= jy + *m) {
		wn1[is + jy * wn1_dim1] = wn1[is + jy * wn1_dim1] + temp1 - 
			temp3;
	    } else {
		wn1[is + jy * wn1_dim1] = wn1[is + jy * wn1_dim1] - temp1 + 
			temp3;
	    }
	    jpntr = jpntr % *m + 1;
/* L55: */
	}
	ipntr = ipntr % *m + 1;
/* L60: */
    }
/*     Form the upper triangle of WN = [D+Y' ZZ'Y/theta   -L_a'+R_z' ] */
/*                                     [-L_a +R_z        S'AA'S*theta] */
    m2 = *m << 1;
    i__1 = *col;
    for (iy = 1; iy <= i__1; ++iy) {
	is = *col + iy;
	is1 = *m + iy;
	i__2 = iy;
	for (jy = 1; jy <= i__2; ++jy) {
	    js = *col + jy;
	    js1 = *m + jy;
	    wn[jy + iy * wn_dim1] = wn1[iy + jy * wn1_dim1] / *theta;
	    wn[js + is * wn_dim1] = wn1[is1 + js1 * wn1_dim1] * *theta;
/* L65: */
	}
	i__2 = iy - 1;
	for (jy = 1; jy <= i__2; ++jy) {
	    wn[jy + is * wn_dim1] = -wn1[is1 + jy * wn1_dim1];
/* L66: */
	}
	i__2 = *col;
	for (jy = iy; jy <= i__2; ++jy) {
	    wn[jy + is * wn_dim1] = wn1[is1 + jy * wn1_dim1];
/* L67: */
	}
	wn[iy + iy * wn_dim1] += sy[iy + iy * sy_dim1];
/* L70: */
    }
/*     Form the upper triangle of WN= [  LL'            L^-1(-L_a'+R_z')] */
/*                                    [(-L_a +R_z)L'^-1   S'AA'S*theta  ] */
/*        first Cholesky factor (1,1) block of wn to get LL' */
/*                          with L' stored in the upper triangle of wn. */
    dpofa_(&wn[wn_offset], &m2, col, info);
    if (*info != 0) {
	*info = -1;
	return 0;
    }
/*        then form L^-1(-L_a'+R_z') in the (1,2) block. */
    col2 = *col << 1;
    i__1 = col2;
    for (js = *col + 1; js <= i__1; ++js) {
	dtrsl_(&wn[wn_offset], &m2, col, &wn[js * wn_dim1 + 1], &c__11, info);
/* L71: */
    }
/*     Form S'AA'S*theta + (L^-1(-L_a'+R_z'))'L^-1(-L_a'+R_z') in the */
/*        upper triangle of (2,2) block of wn. */
    i__1 = col2;
    for (is = *col + 1; is <= i__1; ++is) {
	i__2 = col2;
	for (js = is; js <= i__2; ++js) {
	    wn[is + js * wn_dim1] += ddot_(col, &wn[is * wn_dim1 + 1], &c__1, 
		    &wn[js * wn_dim1 + 1], &c__1);
/* L74: */
	}
/* L72: */
    }
/*     Cholesky factorization of (2,2) block of wn. */
    dpofa_(&wn[*col + 1 + (*col + 1) * wn_dim1], &m2, col, info);
    if (*info != 0) {
	*info = -2;
	return 0;
    }
    return 0;
}